

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O2

int damcalc(int num,int sides,aspect dam_aspect)

{
  int iVar1;
  
  switch(dam_aspect) {
  case MINIMISE:
    break;
  case AVERAGE:
    num = ((sides + 1) * num) / 2;
    break;
  case MAXIMISE:
  case EXTREMIFY:
    num = num * sides;
    break;
  case RANDOMISE:
    iVar1 = damroll(num,sides);
    return iVar1;
  default:
    __assert_fail("0 && \"Should never reach here\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-rand.c"
                  ,0x17f,"int damcalc(int, int, aspect)");
  }
  return num;
}

Assistant:

int damcalc(int num, int sides, aspect dam_aspect)
{
	switch (dam_aspect) {
		case MAXIMISE:
		case EXTREMIFY: return num * sides;
		case RANDOMISE: return damroll(num, sides);
		case MINIMISE: return num;
		case AVERAGE: return num * (sides + 1) / 2;
	}

	assert(0 && "Should never reach here");
	return 0;
}